

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxvolume.cc
# Opt level: O2

Int __thiscall
ipx::Maxvolume::ScaleFtran
          (Maxvolume *this,double colscale_jn,Vector *invscale_basic,IndexedVector *ftran)

{
  uint uVar1;
  pointer piVar2;
  bool bVar3;
  Int ii;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  Int pmax;
  anon_class_32_4_08870b64 fcn;
  double vmax;
  Int local_64;
  anon_class_32_4_08870b64 local_60;
  double local_40;
  double local_38;
  
  local_60.colscale_jn = &local_38;
  local_60.vmax = &local_40;
  local_40 = 0.0;
  local_60.pmax = &local_64;
  local_64 = 0;
  local_60.invscale_basic = invscale_basic;
  local_38 = colscale_jn;
  bVar3 = IndexedVector::sparse(ftran);
  if (bVar3) {
    piVar2 = (ftran->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    uVar5 = (ulong)(uint)ftran->nnz_;
    if (ftran->nnz_ < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      iVar4 = piVar2[uVar6];
      ScaleFtran::anon_class_32_4_08870b64::operator()
                (&local_60,iVar4,(ftran->elements_)._M_data + iVar4);
    }
  }
  else {
    uVar1 = (uint)(ftran->elements_)._M_size;
    uVar6 = 0;
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = uVar6;
    }
    iVar4 = 0;
    for (; uVar5 * 8 != uVar6; uVar6 = uVar6 + 8) {
      ScaleFtran::anon_class_32_4_08870b64::operator()
                (&local_60,iVar4,(double *)((long)(ftran->elements_)._M_data + uVar6));
      iVar4 = iVar4 + 1;
    }
  }
  return local_64;
}

Assistant:

Int Maxvolume::ScaleFtran(double colscale_jn, const Vector& invscale_basic,
                          IndexedVector& ftran) {
    double vmax = 0.0;
    Int pmax = 0;
    auto fcn = [&](Int p, double& pivot) {
        double scaled_pivot = pivot * colscale_jn * invscale_basic[p];
        double v = std::abs(scaled_pivot);
        if (v > vmax && std::abs(pivot) > kPivotZeroTol) {
            vmax = v;
            pmax = p;
        }
        pivot = scaled_pivot;
    };
    for_each_nonzero(ftran, fcn);
    return pmax;
}